

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_abs>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  long lVar3;
  int iVar4;
  long *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_abs op;
  Mat *m;
  __m512 abs_mask;
  __m256 abs_mask_1;
  __m128 abs_mask_2;
  int local_620;
  undefined1 (*local_5c8) [64];
  int local_5c0;
  undefined8 uStack_110;
  undefined8 uStack_108;
  
  lVar3 = in_RDI[7];
  iVar4 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_5c0 = 0; local_5c0 < (int)lVar3; local_5c0 = local_5c0 + 1) {
    local_5c8 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_5c0 * in_RDI[2]);
    for (local_620 = 0; local_620 + 0xf < iVar4; local_620 = local_620 + 0x10) {
      auVar5 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpandd_avx512f(auVar5,*local_5c8);
      *local_5c8 = auVar5;
      local_5c8 = local_5c8 + 1;
    }
    for (; local_620 + 7 < iVar4; local_620 = local_620 + 8) {
      auVar7 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar7 = vpinsrd_avx(auVar7,0x7fffffff,2);
      auVar7 = vpinsrd_avx(auVar7,0x7fffffff,3);
      auVar1 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,2);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,3);
      auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
      uStack_110 = auVar6._0_8_;
      uStack_108 = auVar6._8_8_;
      auVar2._16_8_ = uStack_110;
      auVar2._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar1;
      auVar2._24_8_ = uStack_108;
      auVar2 = vpand_avx2(auVar2,*(undefined1 (*) [32])*local_5c8);
      *(undefined1 (*) [32])*local_5c8 = auVar2;
      local_5c8 = (undefined1 (*) [64])(*local_5c8 + 0x20);
    }
    for (; local_620 + 3 < iVar4; local_620 = local_620 + 4) {
      auVar7 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar7 = vpinsrd_avx(auVar7,0x7fffffff,2);
      auVar7 = vpinsrd_avx(auVar7,0x7fffffff,3);
      auVar7 = vpand_avx(auVar7,*(undefined1 (*) [16])*local_5c8);
      *(undefined1 (*) [16])*local_5c8 = auVar7;
      local_5c8 = (undefined1 (*) [64])(*local_5c8 + 0x10);
    }
    for (; local_620 < iVar4; local_620 = local_620 + 1) {
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar7 = vpand_avx(ZEXT416(*(uint *)*local_5c8),auVar7);
      *(int *)*local_5c8 = auVar7._0_4_;
      local_5c8 = (undefined1 (*) [64])(*local_5c8 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}